

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O3

void __thiscall
Diligent::DeviceContextVkImpl::BuildTLAS(DeviceContextVkImpl *this,BuildTLASAttribs *Attribs)

{
  Uint32 *pUVar1;
  undefined8 *puVar2;
  BufferVkImpl *pBVar3;
  BufferVkImpl *pSrcPtr;
  TLASBuildInstanceData *pTVar4;
  BottomLevelASVkImpl *BLAS;
  ulong uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  bool bVar11;
  VkGeometryInstanceFlagsKHR VVar12;
  VkBuildAccelerationStructureFlagsKHR VVar13;
  VkBuildAccelerationStructureModeKHR VVar14;
  VkDeviceAddress VVar15;
  ulong uVar16;
  undefined8 *puVar17;
  ulong uVar18;
  TopLevelASVkImpl *TLAS;
  long lVar19;
  TLASInstanceDesc TVar20;
  string msg_1;
  VkAccelerationStructureBuildGeometryInfoKHR vkASBuildInfo;
  VkAccelerationStructureBuildRangeInfoKHR *vkRangePtr;
  VulkanUploadAllocation TmpSpace;
  string local_148;
  undefined1 local_128 [20];
  VkBuildAccelerationStructureFlagsKHR VStack_114;
  VkBuildAccelerationStructureModeKHR VStack_110;
  undefined4 uStack_10c;
  VkAccelerationStructureKHR local_108;
  VkAccelerationStructureKHR pVStack_100;
  undefined8 local_f8;
  VkAccelerationStructureGeometryKHR *pVStack_f0;
  VkAccelerationStructureGeometryKHR **local_e8;
  VkDeviceOrHostAddressKHR VStack_e0;
  VkDeviceSize local_d8;
  BufferVkImpl *local_d0;
  BufferVkImpl *local_c8;
  TopLevelASVkImpl *local_c0;
  BuildTLASAttribs *local_b8;
  VkAccelerationStructureBuildRangeInfoKHR *local_b0;
  VkAccelerationStructureGeometryKHR local_a8;
  VkAccelerationStructureBuildRangeInfoKHR local_40;
  
  DeviceContextBase<Diligent::EngineVkImplTraits>::BuildTLAS
            ((DeviceContextBase<Diligent::EngineVkImplTraits> *)this,Attribs,0);
  TLAS = (TopLevelASVkImpl *)Attribs->pTLAS;
  if (TLAS != (TopLevelASVkImpl *)0x0) {
    CheckDynamicType<Diligent::TopLevelASVkImpl,Diligent::ITopLevelAS>((ITopLevelAS *)TLAS);
  }
  pBVar3 = (BufferVkImpl *)Attribs->pScratchBuffer;
  if (pBVar3 != (BufferVkImpl *)0x0) {
    CheckDynamicType<Diligent::BufferVkImpl,Diligent::IBuffer>((IBuffer *)pBVar3);
  }
  pSrcPtr = (BufferVkImpl *)Attribs->pInstanceBuffer;
  if (pSrcPtr != (BufferVkImpl *)0x0) {
    CheckDynamicType<Diligent::BufferVkImpl,Diligent::IBuffer>((IBuffer *)pSrcPtr);
  }
  EnsureVkCmdBuffer(this);
  TransitionOrVerifyTLASState
            (this,TLAS,Attribs->TLASTransitionMode,RESOURCE_STATE_BUILD_AS_WRITE,
             "Build TopLevelAS (DeviceContextVkImpl::BuildTLAS)");
  TransitionOrVerifyBufferState
            (this,pBVar3,Attribs->ScratchBufferTransitionMode,RESOURCE_STATE_BUILD_AS_WRITE,
             VK_ACCESS_ACCELERATION_STRUCTURE_WRITE_BIT_KHR,
             "Build TopLevelAS (DeviceContextVkImpl::BuildTLAS)");
  if (Attribs->Update == true) {
    bVar11 = TopLevelASBase<Diligent::EngineVkImplTraits>::UpdateInstances
                       ((TopLevelASBase<Diligent::EngineVkImplTraits> *)TLAS,Attribs->pInstances,
                        Attribs->InstanceCount,Attribs->BaseContributionToHitGroupIndex,
                        Attribs->HitGroupStride,Attribs->BindingMode);
  }
  else {
    bVar11 = TopLevelASBase<Diligent::EngineVkImplTraits>::SetInstanceData
                       ((TopLevelASBase<Diligent::EngineVkImplTraits> *)TLAS,Attribs->pInstances,
                        Attribs->InstanceCount,Attribs->BaseContributionToHitGroupIndex,
                        Attribs->HitGroupStride,Attribs->BindingMode);
  }
  if (bVar11 != false) {
    local_d8 = (ulong)Attribs->InstanceCount << 6;
    local_d0 = pSrcPtr;
    local_c8 = pBVar3;
    VulkanUploadHeap::Allocate
              ((VulkanUploadAllocation *)&local_a8,&this->m_UploadHeap,local_d8,0x10);
    if (Attribs->InstanceCount != 0) {
      lVar19 = 0x45;
      uVar16 = 0;
      local_c0 = TLAS;
      local_b8 = Attribs;
      do {
        pTVar4 = Attribs->pInstances;
        TVar20 = TopLevelASBase<Diligent::EngineVkImplTraits>::GetInstanceDesc
                           (&local_c0->super_TopLevelASBase<Diligent::EngineVkImplTraits>,
                            *(char **)((long)((pTVar4->Transform).data + -6) + 0xb + lVar19));
        if (Attribs->InstanceCount <= TVar20.InstanceIndex) {
          FormatString<char[32]>
                    ((string *)local_128,(char (*) [32])"Failed to find instance by name");
          DebugAssertionFailed
                    ((Char *)local_128._0_8_,"BuildTLAS",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                     ,0xe88);
          if ((undefined1 *)local_128._0_8_ == local_128 + 0x10) {
            return;
          }
          operator_delete((void *)local_128._0_8_,stack0xfffffffffffffee8 + 1);
          return;
        }
        puVar17 = (undefined8 *)((TVar20._0_8_ >> 0x20) * 0x40 + (long)local_a8.pNext);
        BLAS = *(BottomLevelASVkImpl **)((long)((pTVar4->Transform).data + -5) + 3 + lVar19);
        if (BLAS != (BottomLevelASVkImpl *)0x0) {
          CheckDynamicType<Diligent::BottomLevelASVkImpl,Diligent::IBottomLevelAS>
                    ((IBottomLevelAS *)BLAS);
        }
        puVar2 = (undefined8 *)((long)((pTVar4->Transform).data + -5) + 0xb + lVar19);
        uVar6 = *puVar2;
        uVar7 = puVar2[1];
        puVar2 = (undefined8 *)((long)((pTVar4->Transform).data + -4) + 0xb + lVar19);
        uVar8 = *puVar2;
        uVar9 = puVar2[1];
        puVar2 = (undefined8 *)((long)((pTVar4->Transform).data + -3) + 0xb + lVar19);
        uVar10 = puVar2[1];
        puVar17[4] = *puVar2;
        puVar17[5] = uVar10;
        puVar17[2] = uVar8;
        puVar17[3] = uVar9;
        *puVar17 = uVar6;
        puVar17[1] = uVar7;
        uVar5 = puVar17[6];
        uVar18 = (TVar20._0_8_ << 0x20 |
                 (ulong)*(uint *)((long)((pTVar4->Transform).data + -2) + 0xb + lVar19)) &
                 0xffffff00ffffff;
        puVar17[6] = uVar18 | uVar5 & 0xff000000ff000000;
        puVar17[6] = uVar18 | uVar5 & 0xff00000000000000 |
                     (ulong)*(byte *)((long)((pTVar4->Transform).data + -1) + lVar19) << 0x18;
        VVar12 = InstanceFlagsToVkGeometryInstanceFlags
                           (*(RAYTRACING_INSTANCE_FLAGS *)
                             ((long)((pTVar4->Transform).data + -2) + 0xf + lVar19));
        Attribs = local_b8;
        *(char *)((long)puVar17 + 0x37) = (char)VVar12;
        puVar17[7] = BLAS->m_DeviceAddress;
        TransitionOrVerifyBLASState
                  (this,BLAS,local_b8->BLASTransitionMode,RESOURCE_STATE_BUILD_AS_READ,
                   "Build TopLevelAS (DeviceContextVkImpl::BuildTLAS)");
        uVar16 = uVar16 + 1;
        lVar19 = lVar19 + 0x50;
        TLAS = local_c0;
      } while (uVar16 < Attribs->InstanceCount);
    }
    pBVar3 = local_d0;
    UpdateBufferRegion(this,local_d0,Attribs->InstanceBufferOffset,local_d8,(VkBuffer)local_a8._0_8_
                       ,local_a8.geometry._0_8_,Attribs->InstanceBufferTransitionMode);
    TransitionOrVerifyBufferState
              (this,pBVar3,Attribs->InstanceBufferTransitionMode,RESOURCE_STATE_BUILD_AS_READ,
               VK_ACCESS_SHADER_READ_BIT,"Build TopLevelAS (DeviceContextVkImpl::BuildTLAS)");
    local_e8 = (VkAccelerationStructureGeometryKHR **)0x0;
    VStack_e0.deviceAddress = 0;
    local_f8._0_4_ = 0;
    local_f8._4_4_ = 0;
    pVStack_f0 = (VkAccelerationStructureGeometryKHR *)0x0;
    local_108 = (VkAccelerationStructureKHR)0x0;
    pVStack_100 = (VkAccelerationStructureKHR)0x0;
    stack0xfffffffffffffee8 = 0;
    _VStack_110 = 0;
    local_128._0_8_ = (pointer)0x0;
    local_128._8_8_ = (void *)0x0;
    local_b0 = &local_40;
    local_40.transformOffset = 0;
    local_40.primitiveOffset = 0;
    local_40.firstVertex = 0;
    local_a8.geometry.triangles.transformData = (VkDeviceOrHostAddressConstKHR)0x0;
    local_a8._88_8_ = 0;
    local_a8.geometry._40_8_ = 0;
    local_a8.geometry.triangles.indexData = (VkDeviceOrHostAddressConstKHR)0x0;
    local_a8.geometry.aabbs.stride = 0;
    local_a8.geometry.triangles.vertexStride = 0;
    local_a8.geometry.triangles.pNext = (void *)0x0;
    local_a8.pNext = (void *)0x0;
    local_40.primitiveCount = Attribs->InstanceCount;
    local_a8._0_8_ = (VkBuffer)0x3b9d13f6;
    local_a8._16_8_ = 2;
    local_a8.geometry._0_8_ = 0x3b9d13f4;
    local_a8.geometry.aabbs.data = (VkDeviceOrHostAddressConstKHR)0x0;
    VVar15 = BufferVkImpl::GetVkDeviceAddress(pBVar3);
    pBVar3 = local_c8;
    local_a8.geometry.aabbs.stride = VVar15 + Attribs->InstanceBufferOffset;
    if ((local_a8.geometry.aabbs.stride & 0xf) != 0) {
      FormatString<char[46]>
                (&local_148,(char (*) [46])"Instance data address is not properly aligned");
      DebugAssertionFailed
                (local_148._M_dataplus._M_p,"BuildTLAS",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                 ,0xeb2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p != &local_148.field_2) {
        operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
      }
    }
    local_128._0_4_ = VK_STRUCTURE_TYPE_ACCELERATION_STRUCTURE_BUILD_GEOMETRY_INFO_KHR;
    stack0xfffffffffffffee8 = stack0xfffffffffffffee8 & 0xffffffff00000000;
    VVar13 = BuildASFlagsToVkBuildAccelerationStructureFlags
                       ((TLAS->super_TopLevelASBase<Diligent::EngineVkImplTraits>).
                        super_DeviceObjectBase<Diligent::ITopLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::TopLevelASDesc>
                        .m_Desc.Flags);
    VStack_114 = VVar13;
    VVar14 = CONCAT31(0,Attribs->Update);
    VStack_110 = VVar14;
    pVStack_100 = (TLAS->m_VulkanTLAS).m_VkObject;
    local_108 = (VkAccelerationStructureKHR_T *)0x0;
    if (VVar14 != VK_BUILD_ACCELERATION_STRUCTURE_MODE_BUILD_KHR) {
      local_108 = pVStack_100;
    }
    local_f8._0_4_ = 1;
    pVStack_f0 = &local_a8;
    local_e8 = (VkAccelerationStructureGeometryKHR **)0x0;
    VVar15 = BufferVkImpl::GetVkDeviceAddress(pBVar3);
    VStack_e0.hostAddress = (void *)(VVar15 + Attribs->ScratchBufferOffset);
    if (VStack_e0.deviceAddress %
        (ulong)*(uint32_t *)
                ((long)&(((((this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                            super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pDevice.
                           m_pObject)->m_PhysicalDevice)._M_t.
                          super___uniq_ptr_impl<VulkanUtilities::VulkanPhysicalDevice,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_VulkanUtilities::VulkanPhysicalDevice_*,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
                          .super__Head_base<0UL,_VulkanUtilities::VulkanPhysicalDevice_*,_false>.
                         _M_head_impl)->m_ExtProperties).AccelStruct + 0x38) != 0) {
      FormatString<char[53]>
                (&local_148,(char (*) [53])"Scratch buffer start address is not properly aligned");
      DebugAssertionFailed
                (local_148._M_dataplus._M_p,"BuildTLAS",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                 ,0xec0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p != &local_148.field_2) {
        operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
      }
    }
    VulkanUtilities::VulkanCommandBuffer::BuildAccelerationStructure
              (&this->m_CommandBuffer,1,(VkAccelerationStructureBuildGeometryInfoKHR *)local_128,
               &local_b0);
    pUVar1 = &(this->m_State).NumCommands;
    *pUVar1 = *pUVar1 + 1;
  }
  return;
}

Assistant:

void DeviceContextVkImpl::BuildTLAS(const BuildTLASAttribs& Attribs)
{
    TDeviceContextBase::BuildTLAS(Attribs, 0);

    static_assert(TLAS_INSTANCE_DATA_SIZE == sizeof(VkAccelerationStructureInstanceKHR), "Value in TLAS_INSTANCE_DATA_SIZE doesn't match the actual instance description size");

    TopLevelASVkImpl*     pTLASVk      = ClassPtrCast<TopLevelASVkImpl>(Attribs.pTLAS);
    BufferVkImpl*         pScratchVk   = ClassPtrCast<BufferVkImpl>(Attribs.pScratchBuffer);
    BufferVkImpl*         pInstancesVk = ClassPtrCast<BufferVkImpl>(Attribs.pInstanceBuffer);
    const TopLevelASDesc& TLASDesc     = pTLASVk->GetDesc();

    EnsureVkCmdBuffer();

    const char* OpName = "Build TopLevelAS (DeviceContextVkImpl::BuildTLAS)";
    TransitionOrVerifyTLASState(*pTLASVk, Attribs.TLASTransitionMode, RESOURCE_STATE_BUILD_AS_WRITE, OpName);
    TransitionOrVerifyBufferState(*pScratchVk, Attribs.ScratchBufferTransitionMode, RESOURCE_STATE_BUILD_AS_WRITE, VK_ACCESS_ACCELERATION_STRUCTURE_WRITE_BIT_KHR, OpName);

    if (Attribs.Update)
    {
        if (!pTLASVk->UpdateInstances(Attribs.pInstances, Attribs.InstanceCount, Attribs.BaseContributionToHitGroupIndex, Attribs.HitGroupStride, Attribs.BindingMode))
            return;
    }
    else
    {
        if (!pTLASVk->SetInstanceData(Attribs.pInstances, Attribs.InstanceCount, Attribs.BaseContributionToHitGroupIndex, Attribs.HitGroupStride, Attribs.BindingMode))
            return;
    }

    // copy instance data into instance buffer
    {
        size_t                 Size     = Attribs.InstanceCount * sizeof(VkAccelerationStructureInstanceKHR);
        VulkanUploadAllocation TmpSpace = m_UploadHeap.Allocate(Size, 16);

        for (Uint32 i = 0; i < Attribs.InstanceCount; ++i)
        {
            const TLASBuildInstanceData& Inst     = Attribs.pInstances[i];
            const TLASInstanceDesc       InstDesc = pTLASVk->GetInstanceDesc(Inst.InstanceName);

            if (InstDesc.InstanceIndex >= Attribs.InstanceCount)
            {
                UNEXPECTED("Failed to find instance by name");
                return;
            }

            VkAccelerationStructureInstanceKHR& vkASInst = static_cast<VkAccelerationStructureInstanceKHR*>(TmpSpace.CPUAddress)[InstDesc.InstanceIndex];
            BottomLevelASVkImpl*                pBLASVk  = ClassPtrCast<BottomLevelASVkImpl>(Inst.pBLAS);

            static_assert(sizeof(vkASInst.transform) == sizeof(Inst.Transform), "size mismatch");
            std::memcpy(&vkASInst.transform, Inst.Transform.data, sizeof(vkASInst.transform));

            vkASInst.instanceCustomIndex                    = Inst.CustomId;
            vkASInst.instanceShaderBindingTableRecordOffset = InstDesc.ContributionToHitGroupIndex;
            vkASInst.mask                                   = Inst.Mask;
            vkASInst.flags                                  = InstanceFlagsToVkGeometryInstanceFlags(Inst.Flags);
            vkASInst.accelerationStructureReference         = pBLASVk->GetVkDeviceAddress();

            TransitionOrVerifyBLASState(*pBLASVk, Attribs.BLASTransitionMode, RESOURCE_STATE_BUILD_AS_READ, OpName);
        }

        UpdateBufferRegion(pInstancesVk, Attribs.InstanceBufferOffset, Size, TmpSpace.vkBuffer, TmpSpace.AlignedOffset, Attribs.InstanceBufferTransitionMode);
    }
    TransitionOrVerifyBufferState(*pInstancesVk, Attribs.InstanceBufferTransitionMode, RESOURCE_STATE_BUILD_AS_READ, VK_ACCESS_SHADER_READ_BIT, OpName);

    VkAccelerationStructureBuildGeometryInfoKHR     vkASBuildInfo = {};
    VkAccelerationStructureBuildRangeInfoKHR        vkRange       = {};
    VkAccelerationStructureBuildRangeInfoKHR const* vkRangePtr    = &vkRange;
    VkAccelerationStructureGeometryKHR              vkASGeometry  = {};

    vkRange.primitiveCount = Attribs.InstanceCount;

    vkASGeometry.sType        = VK_STRUCTURE_TYPE_ACCELERATION_STRUCTURE_GEOMETRY_KHR;
    vkASGeometry.pNext        = nullptr;
    vkASGeometry.geometryType = VK_GEOMETRY_TYPE_INSTANCES_KHR;
    vkASGeometry.flags        = 0;

    VkAccelerationStructureGeometryInstancesDataKHR& vkASInst{vkASGeometry.geometry.instances};
    vkASInst.sType              = VK_STRUCTURE_TYPE_ACCELERATION_STRUCTURE_GEOMETRY_INSTANCES_DATA_KHR;
    vkASInst.pNext              = nullptr;
    vkASInst.arrayOfPointers    = VK_FALSE;
    vkASInst.data.deviceAddress = pInstancesVk->GetVkDeviceAddress() + Attribs.InstanceBufferOffset;

    // if geometry.arrayOfPointers is VK_FALSE, geometry.instances.data.deviceAddress must be aligned to 16 bytes
    VERIFY(vkASInst.data.deviceAddress % 16 == 0, "Instance data address is not properly aligned");

    vkASBuildInfo.sType                     = VK_STRUCTURE_TYPE_ACCELERATION_STRUCTURE_BUILD_GEOMETRY_INFO_KHR;
    vkASBuildInfo.type                      = VK_ACCELERATION_STRUCTURE_TYPE_TOP_LEVEL_KHR;                    // type must be compatible with create info
    vkASBuildInfo.flags                     = BuildASFlagsToVkBuildAccelerationStructureFlags(TLASDesc.Flags); // flags must be compatible with create info
    vkASBuildInfo.mode                      = Attribs.Update ? VK_BUILD_ACCELERATION_STRUCTURE_MODE_UPDATE_KHR : VK_BUILD_ACCELERATION_STRUCTURE_MODE_BUILD_KHR;
    vkASBuildInfo.srcAccelerationStructure  = Attribs.Update ? pTLASVk->GetVkTLAS() : VK_NULL_HANDLE;
    vkASBuildInfo.dstAccelerationStructure  = pTLASVk->GetVkTLAS();
    vkASBuildInfo.geometryCount             = 1;
    vkASBuildInfo.pGeometries               = &vkASGeometry;
    vkASBuildInfo.ppGeometries              = nullptr;
    vkASBuildInfo.scratchData.deviceAddress = pScratchVk->GetVkDeviceAddress() + Attribs.ScratchBufferOffset;

    const VkPhysicalDeviceAccelerationStructurePropertiesKHR& ASLimits = m_pDevice->GetPhysicalDevice().GetExtProperties().AccelStruct;
    VERIFY(vkASBuildInfo.scratchData.deviceAddress % ASLimits.minAccelerationStructureScratchOffsetAlignment == 0, "Scratch buffer start address is not properly aligned");

    m_CommandBuffer.BuildAccelerationStructure(1, &vkASBuildInfo, &vkRangePtr);
    ++m_State.NumCommands;
}